

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall
PhyloTree::getEdgesNotInCommonWith
          (PhyloTree *this,PhyloTree *t,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  bool bVar1;
  runtime_error *this_00;
  long in_RSI;
  value_type *in_RDI;
  PhyloTreeEdge *that_edge;
  iterator __end2;
  iterator __begin2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range2;
  PhyloTreeEdge *this_edge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  bool not_common;
  PhyloTreeEdge *in_stack_ffffffffffffff78;
  PhyloTreeEdge *in_stack_ffffffffffffff80;
  reference in_stack_ffffffffffffff90;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_60;
  long local_58;
  reference local_50;
  PhyloTreeEdge *local_48;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_40;
  size_type *local_38;
  byte local_19;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff80,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff78);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"leaf2NumMaps are not equal");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = &(in_RDI->super_Bipartition).partition.m_num_bits;
  local_40._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffff78);
  local_48 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator*(&local_40);
    local_19 = 1;
    local_58 = local_10 + 0x20;
    local_60._M_current =
         (PhyloTreeEdge *)
         std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                   (in_stack_ffffffffffffff78);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      in_stack_ffffffffffffff90 =
           __gnu_cxx::
           __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
           ::operator*(&local_60);
      bVar1 = PhyloTreeEdge::sameBipartition(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (bVar1) {
        local_19 = 0;
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++(&local_60);
    }
    if ((local_19 & 1) != 0) {
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_ffffffffffffff90,
                 in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void PhyloTree::getEdgesNotInCommonWith(PhyloTree &t, vector<PhyloTreeEdge>& dest) {
    bool not_common;
    if (leaf2NumMap != t.leaf2NumMap) {
        throw runtime_error("leaf2NumMaps are not equal");
    }
    for (auto &this_edge : edges) {
        not_common = true;
        //if (this_edge.isZero()) continue;

        for (auto &that_edge : t.edges) {
            //if (that_edge.isZero()) continue;
            if (this_edge.sameBipartition(that_edge)) {
                not_common = false;
            }
        }
        if (not_common)
            dest.push_back(this_edge);
    }
}